

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O2

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLPObservation::operator()
          (StoreLPObservation *this,iterator_t *str,iterator_t *end)

{
  parsed_t pVar1;
  ParserPOMDPFormat_Spirit *pPVar2;
  E *this_00;
  uint *__x;
  E e;
  Index aI;
  
  pPVar2 = this->_m_po;
  pVar1 = pPVar2->_m_lp_type;
  if (pVar1 == ASTERICK) {
    __x = &pPVar2->_m_anyJOIndex;
  }
  else {
    if (pVar1 == STRING) {
      aI = MADPComponentDiscreteObservations::GetObservationIndexByName
                     (&(pPVar2->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                       super_MultiAgentDecisionProcessDiscrete._m_O,&pPVar2->_m_lp_string,
                      (Index)((ulong)((long)(pPVar2->_m_lp_JO).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pPVar2->_m_lp_JO).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->_m_po->_m_lp_JO,&aI);
      return;
    }
    if (pVar1 != UINT) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,
           "StoreLPObservation expected that the last parsed type is a action index(uint), action name (string) or wilcard (\'*\')."
          );
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    __x = &pPVar2->_m_lp_uint;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pPVar2->_m_lp_JO,__x);
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {

                if(DEBUG_POMDP_PARSE)
                    std::cout << "StoreLPObservation: pushing "<<std::string(str,end)<< 
                        " on _m_lp_JO"<<std::endl;
                if(_m_po->_m_lp_type == UINT)
                    _m_po->_m_lp_JO.push_back(_m_po->_m_lp_uint);
                else if(_m_po->_m_lp_type == STRING)
                {
                    //make sure that _m_lp_JO is cleared after each joint action
                    //so we can do this:
                    Index curAgIndex =  _m_po->_m_lp_JO.size();
                    try
                    {
                        Index aI = _m_po->GetPOMDPDiscrete()->GetObservationIndexByName(
                            _m_po->_m_lp_string, curAgIndex);
                        _m_po->_m_lp_JO.push_back(aI);
                    }
                    catch(E e)
                    {
                        std::stringstream ermsg; ermsg << e.SoftPrint() << " (at " << 
                            str.get_position() << ")"<<std::endl;
                        throw EParse(ermsg);
                    }
                }
                else if(_m_po->_m_lp_type == ASTERICK )
                    _m_po->_m_lp_JO.push_back(_m_po->_m_anyJOIndex);
                else
                    throw E("StoreLPObservation expected that the last parsed type is a action index(uint), action name (string) or wilcard ('*').");
            }